

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FState * __thiscall
FStateDefinitions::ResolveGotoLabel
          (FStateDefinitions *this,AActor *actor,PClassActor *mytype,char *name)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  PClassActor *this_00;
  long lVar4;
  FState *pFVar5;
  char *classname;
  char *__s;
  
  pcVar3 = strstr(name,"::");
  __s = name;
  this_00 = mytype;
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
    __s = pcVar3 + 2;
    iVar2 = strcasecmp(name,"Super");
    if (iVar2 == 0) {
      this_00 = dyn_cast<PClassActor>((DObject *)(mytype->super_PClass).ParentClass);
    }
    else {
      this_00 = (PClassActor *)PClass::FindClass(name);
      if (this_00 == (PClassActor *)0x0) {
        I_Error("%s is an unknown class.",name);
      }
      bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)this_00);
      if (!bVar1) {
        I_Error("%s is not an actor class, so it has no states.",
                FName::NameData.NameArray
                [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
      bVar1 = PClass::IsAncestorOf((PClass *)this_00,&mytype->super_PClass);
      if (!bVar1) {
        I_Error("%s is not derived from %s so cannot access its states.",
                FName::NameData.NameArray
                [(mytype->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text,
                FName::NameData.NameArray
                [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
    }
  }
  pcVar3 = strchr(__s,0x2b);
  if (pcVar3 == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    *pcVar3 = '\0';
    lVar4 = strtol(pcVar3 + 1,(char **)0x0,0);
    iVar2 = (int)lVar4;
  }
  if (this_00 == mytype) {
    pFVar5 = FindState(this,__s);
  }
  else {
    pFVar5 = PClassActor::FindStateByString(this_00,__s,true);
  }
  if (pFVar5 == (FState *)0x0) {
    if (iVar2 == 0) {
      pFVar5 = (FState *)0x0;
      Printf("\x1cGAttempt to get invalid state %s from actor %s.\n",__s,
             FName::NameData.NameArray
             [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
    }
    else {
      pFVar5 = (FState *)0x0;
      I_Error("Attempt to get invalid state %s from actor %s.",__s);
    }
  }
  else {
    pFVar5 = pFVar5 + iVar2;
  }
  if (name != (char *)0x0) {
    operator_delete__(name);
  }
  return pFVar5;
}

Assistant:

FState *FStateDefinitions::ResolveGotoLabel (AActor *actor, PClassActor *mytype, char *name)
{
	PClassActor *type = mytype;
	FState *state;
	char *namestart = name;
	char *label, *offset, *pt;
	int v;

	// Check for classname
	if ((pt = strstr (name, "::")) != NULL)
	{
		const char *classname = name;
		*pt = '\0';
		name = pt + 2;

		// The classname may either be "Super" to identify this class's immediate
		// superclass, or it may be the name of any class that this one derives from.
		if (stricmp (classname, "Super") == 0)
		{
			type = dyn_cast<PClassActor>(type->ParentClass);
			actor = GetDefaultByType(type);
		}
		else
		{
			// first check whether a state of the desired name exists
			PClass *stype = PClass::FindClass (classname);
			if (stype == NULL)
			{
				I_Error ("%s is an unknown class.", classname);
			}
			if (!stype->IsDescendantOf (RUNTIME_CLASS(AActor)))
			{
				I_Error ("%s is not an actor class, so it has no states.", stype->TypeName.GetChars());
			}
			if (!stype->IsAncestorOf (type))
			{
				I_Error ("%s is not derived from %s so cannot access its states.",
					type->TypeName.GetChars(), stype->TypeName.GetChars());
			}
			if (type != stype)
			{
				type = static_cast<PClassActor *>(stype);
				actor = GetDefaultByType (type);
			}
		}
	}
	label = name;
	// Check for offset
	offset = NULL;
	if ((pt = strchr (name, '+')) != NULL)
	{
		*pt = '\0';
		offset = pt + 1;
	}
	v = offset ? strtol (offset, NULL, 0) : 0;

	// Get the state's address.
	if (type == mytype)
	{
		state = FindState (label);
	}
	else
	{
		state = type->FindStateByString(label, true);
	}

	if (state != NULL)
	{
		state += v;
	}
	else if (v != 0)
	{
		I_Error ("Attempt to get invalid state %s from actor %s.", label, type->TypeName.GetChars());
	}
	else
	{
		Printf (TEXTCOLOR_RED "Attempt to get invalid state %s from actor %s.\n", label, type->TypeName.GetChars());
	}
	delete[] namestart;		// free the allocated string buffer
	return state;
}